

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specwriter.cpp
# Opt level: O2

string * apngasm::spec::anon_unknown_0::createRelativeDir
                   (string *__return_storage_ptr__,string *from,string *to)

{
  char cVar1;
  bool bVar2;
  reference pvVar3;
  byte bVar4;
  ulong uVar5;
  size_type __n;
  ulong uVar6;
  size_type sVar7;
  string fromDir;
  string parentDir;
  string toDir;
  path fromPath;
  string separatorStr;
  path toPath;
  
  createAbsolutePath(&fromPath,from);
  createAbsolutePath(&toPath,to);
  separatorStr._M_dataplus._M_p = (pointer)&separatorStr.field_2;
  separatorStr.field_2._M_allocated_capacity._0_2_ = 0x2f;
  separatorStr._M_string_length = 1;
  std::filesystem::__cxx11::path::string(&fromDir,&fromPath);
  cVar1 = fromDir._M_dataplus._M_p[fromDir._M_string_length - 1];
  std::__cxx11::string::~string((string *)&fromDir);
  if (cVar1 != '/') {
    std::filesystem::__cxx11::path::operator/=(&fromPath,&separatorStr);
  }
  std::filesystem::__cxx11::path::string(&fromDir,&toPath);
  cVar1 = fromDir._M_dataplus._M_p[fromDir._M_string_length - 1];
  std::__cxx11::string::~string((string *)&fromDir);
  if (cVar1 != '/') {
    std::filesystem::__cxx11::path::operator/=(&toPath,&separatorStr);
  }
  std::filesystem::__cxx11::path::root_name();
  std::filesystem::__cxx11::path::root_name();
  bVar2 = std::filesystem::__cxx11::operator==((path *)&fromDir,(path *)&toDir);
  std::filesystem::__cxx11::path::~path((path *)&toDir);
  std::filesystem::__cxx11::path::~path((path *)&fromDir);
  if (bVar2) {
    std::filesystem::__cxx11::path::string(&fromDir,&fromPath);
    std::filesystem::__cxx11::path::string(&toDir,&toPath);
    sVar7 = fromDir._M_string_length;
    if (toDir._M_string_length < fromDir._M_string_length) {
      sVar7 = toDir._M_string_length;
    }
    __n = 0;
    uVar6 = sVar7 & 0xffffffff;
    if ((int)sVar7 < 1) {
      uVar6 = __n;
    }
    uVar5 = 0xffffffffffffffff;
    for (; uVar6 != __n; __n = __n + 1) {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (&fromDir,__n);
      cVar1 = *pvVar3;
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (&toDir,__n);
      if (cVar1 != *pvVar3) break;
      if (cVar1 == '/') {
        uVar5 = __n;
      }
      uVar5 = uVar5 & 0xffffffff;
    }
    if ((int)uVar5 != -1) {
      sVar7 = (size_type)((int)uVar5 + 1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&parentDir,&fromDir,sVar7,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&fromDir,&parentDir);
      std::__cxx11::string::~string((string *)&parentDir);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&parentDir,&toDir,sVar7,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&toDir,&parentDir);
      std::__cxx11::string::~string((string *)&parentDir);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&parentDir);
    if (fromDir._M_string_length != 0) {
      std::operator+(&parentDir,"..",&separatorStr);
      sVar7 = 0;
      uVar6 = fromDir._M_string_length & 0xffffffff;
      if ((int)fromDir._M_string_length < 1) {
        uVar6 = sVar7;
      }
      bVar4 = 1;
      for (; uVar6 != sVar7; sVar7 = sVar7 + 1) {
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                           (&fromDir,sVar7);
        if ((bool)(*pvVar3 != '/' | bVar4)) {
          bVar4 = bVar4 & *pvVar3 == '/';
        }
        else {
          bVar4 = 1;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&parentDir);
        }
      }
      std::__cxx11::string::~string((string *)&parentDir);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&toDir);
    std::__cxx11::string::~string((string *)&toDir);
    std::__cxx11::string::~string((string *)&fromDir);
  }
  else {
    std::filesystem::__cxx11::path::string(__return_storage_ptr__,&fromPath);
  }
  std::__cxx11::string::~string((string *)&separatorStr);
  std::filesystem::__cxx11::path::~path(&toPath);
  std::filesystem::__cxx11::path::~path(&fromPath);
  return __return_storage_ptr__;
}

Assistant:

const std::string createRelativeDir(const std::string& from, const std::string& to)
      {
        std::filesystem::path fromPath = createAbsolutePath(from);
        std::filesystem::path toPath = createAbsolutePath(to);
        const std::string separatorStr = std::string(1, separator);

        // Convert path to native.
        fromPath.make_preferred();
        toPath.make_preferred();
        if (*fromPath.string().rbegin() != separator)
          fromPath /= separatorStr;
        if (*toPath.string().rbegin() != separator)
          toPath /= separatorStr;

        // Other drive.
        if(fromPath.root_name() != toPath.root_name())
          return fromPath.string();

        // Same drive.
        std::string fromDir = fromPath.string();
        std::string toDir = toPath.string();

        {
          const int count = std::min(fromDir.length(), toDir.length());
          int find = -1;
          for (int i = 0;  i < count;  ++i) {
            const char fromChar = fromDir.at(i);
            const char toChar = toDir.at(i);

            if (fromChar == toChar) {
              if (fromChar == separator)
                find = i;
            }
            else
              break;
          } if (find != -1) {
            fromDir = fromDir.substr(find + 1);
            toDir = toDir.substr(find + 1);
          }
        }

        std::string result = "";
        if (!fromDir.empty()) {
          const int count = fromDir.length();
          const std::string parentDir = ".." + separatorStr;
          bool beforeIsSeparator = true;
          for (int i = 0;  i < count;  ++i) {
            const char currentChar = fromDir.at(i);
            if (currentChar == separator) {
              if (!beforeIsSeparator) {
                result += parentDir;
                beforeIsSeparator = true;
              }
            } else {
              beforeIsSeparator = false;
            }
          }
        }
        result += toDir;

        return result;
      }